

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tp_linear.hpp
# Opt level: O0

double sisl::tp_linear::phi<3>(vector *p)

{
  CoeffReturnType t;
  double dVar1;
  undefined4 local_1c;
  double dStack_18;
  uint i;
  double prod;
  vector *p_local;
  
  dStack_18 = 1.0;
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    t = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                  ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)p,(ulong)local_1c);
    dVar1 = bspline_1(t);
    dStack_18 = dVar1 * dStack_18;
  }
  return dStack_18;
}

Assistant:

static const double phi(const vector &p) {
            double prod = 1;
            for(unsigned int i = 0; i < N; i++) prod *= bspline_1(p[i]);
            return prod;
        }